

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::StreamArchive::StreamArchive(StreamArchive *this,string *path_,DatabaseMode mode_)

{
  __node_base_ptr *pp_Var1;
  long lVar2;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__StreamArchive_0016ca80;
  this->imported_metadata = (ExportedMetadataHeader *)0x0;
  this->file = (FILE *)0x0;
  std::__cxx11::string::string((string *)&this->path,(string *)path_);
  pp_Var1 = &this->seen_blobs[0]._M_h._M_single_bucket;
  lVar2 = 0x230;
  do {
    ((_Hashtable *)(pp_Var1 + -6))->_M_buckets = pp_Var1;
    pp_Var1[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var1 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var1[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var1 + -2))->_M_max_load_factor = 1.0;
    pp_Var1[-1] = (__node_base_ptr)0x0;
    *pp_Var1 = (__node_base_ptr)0x0;
    pp_Var1 = pp_Var1 + 7;
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != 0);
  this->mode = mode_;
  (this->read_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->read_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->read_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->read_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->read_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  this->zlib_buffer = (uint8_t *)0x0;
  this->zlib_buffer_size = 0;
  this->alive = false;
  return;
}

Assistant:

StreamArchive(const string &path_, DatabaseMode mode_)
		: DatabaseInterface(mode_), path(path_), mode(mode_)
	{
	}